

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_AddNodes_single
               (UA_Server *server,UA_Session *session,UA_AddNodesItem *item,
               UA_AddNodesResult *result,UA_InstantiationCallback *instantiationCallback)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  UA_NodeClass UVar11;
  UA_VariableAttributes *attr;
  UA_SecureChannel *pUVar12;
  undefined1 uVar13;
  UA_StatusCode UVar14;
  uint uVar15;
  UA_StatusCode UVar16;
  UA_VariableNode *vnode;
  UA_DataType *pUVar17;
  char *pcVar18;
  UA_Logger logger;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_48;
  UA_UInt32 local_40;
  uint local_3c;
  ulong local_38;
  
  UVar16 = 0x80620000;
  if ((UA_EXTENSIONOBJECT_ENCODED_XML < (item->nodeAttributes).encoding) &&
     ((item->nodeAttributes).content.decoded.type != (UA_DataType *)0x0)) {
    vnode = (UA_VariableNode *)UA_NodeStore_newNode(item->nodeClass);
    if (vnode == (UA_VariableNode *)0x0) {
      UVar16 = 0x80030000;
    }
    else {
      attr = (UA_VariableAttributes *)(item->nodeAttributes).content.decoded.data;
      UVar14 = copyStandardAttributes((UA_Node *)vnode,item,(UA_NodeAttributes *)attr);
      UVar11 = item->nodeClass;
      if (UVar11 == UA_NODECLASS_VIEW) {
        UVar16 = 0x80620000;
        if ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x13b8a0) {
          *(undefined1 *)((long)&(vnode->dataType).namespaceIndex + 1) =
               *(undefined1 *)&(attr->value).type;
          uVar13 = *(undefined1 *)((long)&(attr->value).type + 1);
LAB_0011e7a0:
          *(undefined1 *)&(vnode->dataType).namespaceIndex = uVar13;
LAB_0011e7de:
          UVar16 = UVar14;
          if (UVar14 == 0) {
            result->statusCode = 0;
            UVar16 = Service_AddNodes_existing
                               (server,session,(UA_Node *)vnode,(UA_NodeId *)item,
                                &item->referenceTypeId,&(item->typeDefinition).nodeId,
                                instantiationCallback,&result->addedNodeId);
            result->statusCode = UVar16;
            if (UVar16 == 0) {
              return;
            }
            logger = (server->config).logger;
            pUVar12 = session->channel;
            if (pUVar12 == (UA_SecureChannel *)0x0) {
              local_3c = 0;
              local_40 = 0;
            }
            else {
              if (pUVar12->connection == (UA_Connection *)0x0) {
                local_3c = 0;
              }
              else {
                local_3c = pUVar12->connection->sockfd;
              }
              local_40 = (pUVar12->securityToken).channelId;
            }
            uVar15 = (session->sessionId).identifier.numeric;
            uVar9 = (session->sessionId).identifier.guid.data2;
            uVar10 = (session->sessionId).identifier.guid.data3;
            bVar1 = (session->sessionId).identifier.guid.data4[0];
            bVar2 = (session->sessionId).identifier.guid.data4[1];
            bVar3 = (session->sessionId).identifier.guid.data4[2];
            bVar4 = (session->sessionId).identifier.guid.data4[3];
            bVar5 = (session->sessionId).identifier.guid.data4[4];
            bVar6 = (session->sessionId).identifier.guid.data4[5];
            bVar7 = (session->sessionId).identifier.guid.data4[6];
            bVar8 = (session->sessionId).identifier.guid.data4[7];
            pcVar18 = UA_StatusCode_name(UVar16);
            goto LAB_0011e8d3;
          }
        }
      }
      else if (UVar11 == UA_NODECLASS_VARIABLE) {
        UVar16 = 0x80620000;
        if ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x13b9c0) {
          uVar15 = copyVariableNodeAttributes(server,vnode,item,attr);
          goto LAB_0011e7d3;
        }
      }
      else if (UVar11 == UA_NODECLASS_OBJECTTYPE) {
        pUVar17 = (UA_DataType *)0x13bea0;
LAB_0011e790:
        UVar16 = 0x80620000;
        if ((item->nodeAttributes).content.decoded.type == pUVar17) {
          uVar13 = *(undefined1 *)&(attr->value).type;
          goto LAB_0011e7a0;
        }
      }
      else if (UVar11 == UA_NODECLASS_VARIABLETYPE) {
        UVar16 = 0x80620000;
        if ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x13c530) {
          vnode->accessLevel = attr->accessLevel;
          uVar15 = copyCommonVariableAttributes(server,vnode,item,attr);
LAB_0011e7d3:
          UVar14 = UVar14 | uVar15;
          goto LAB_0011e7de;
        }
      }
      else {
        if (UVar11 != UA_NODECLASS_REFERENCETYPE) {
          if (UVar11 == UA_NODECLASS_DATATYPE) {
            pUVar17 = (UA_DataType *)0x13c0b0;
          }
          else {
            UVar16 = 0x805f0000;
            if (UVar11 != UA_NODECLASS_OBJECT) goto LAB_0011e7ea;
            pUVar17 = (UA_DataType *)0x13c7a0;
          }
          goto LAB_0011e790;
        }
        UVar16 = 0x80620000;
        if ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x13c6e0) {
          *(undefined1 *)&(vnode->dataType).namespaceIndex = *(undefined1 *)&(attr->value).type;
          *(undefined1 *)((long)&(vnode->dataType).namespaceIndex + 1) =
               *(undefined1 *)((long)&(attr->value).type + 1);
          uVar15 = UA_LocalizedText_copy
                             ((UA_LocalizedText *)&(attr->value).storageType,
                              (UA_LocalizedText *)&(vnode->dataType).identifier.string);
          goto LAB_0011e7d3;
        }
      }
LAB_0011e7ea:
      UA_NodeStore_deleteNode((UA_Node *)vnode);
    }
  }
  result->statusCode = UVar16;
  logger = (server->config).logger;
  pUVar12 = session->channel;
  if (pUVar12 == (UA_SecureChannel *)0x0) {
    local_3c = 0;
    local_40 = 0;
  }
  else {
    if (pUVar12->connection == (UA_Connection *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = pUVar12->connection->sockfd;
    }
    local_40 = (pUVar12->securityToken).channelId;
  }
  uVar15 = (session->sessionId).identifier.numeric;
  uVar9 = (session->sessionId).identifier.guid.data2;
  uVar10 = (session->sessionId).identifier.guid.data3;
  bVar1 = (session->sessionId).identifier.guid.data4[0];
  bVar2 = (session->sessionId).identifier.guid.data4[1];
  bVar3 = (session->sessionId).identifier.guid.data4[2];
  bVar4 = (session->sessionId).identifier.guid.data4[3];
  bVar5 = (session->sessionId).identifier.guid.data4[4];
  bVar6 = (session->sessionId).identifier.guid.data4[5];
  bVar7 = (session->sessionId).identifier.guid.data4[6];
  bVar8 = (session->sessionId).identifier.guid.data4[7];
  pcVar18 = UA_StatusCode_name(UVar16);
LAB_0011e8d3:
  local_38 = (ulong)uVar9;
  local_48 = (ulong)uVar10;
  local_58 = (ulong)bVar4;
  local_60 = (ulong)bVar3;
  local_68 = (ulong)bVar2;
  local_70 = (ulong)bVar1;
  UA_LOG_INFO(logger,UA_LOGCATEGORY_SESSION,
              "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Could not add node with error code %s"
              ,(ulong)local_3c,(ulong)local_40,(ulong)uVar15,local_38,local_48,local_70,local_68,
              local_60,local_58,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7,(ulong)bVar8,pcVar18);
  return;
}

Assistant:

static void
Service_AddNodes_single(UA_Server *server, UA_Session *session,
                        const UA_AddNodesItem *item, UA_AddNodesResult *result,
                        UA_InstantiationCallback *instantiationCallback) {
    /* Create the node from the attributes*/
    UA_Node *node = NULL;
    result->statusCode = createNodeFromAttributes(server, item, &node);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Could not add node with error code %s",
                            UA_StatusCode_name(result->statusCode));
        return;
    }

    /* Run consistency checks and add the node */
    UA_assert(node != NULL);
    result->statusCode = Service_AddNodes_existing(server, session, node, &item->parentNodeId.nodeId,
                                                   &item->referenceTypeId, &item->typeDefinition.nodeId,
                                                   instantiationCallback, &result->addedNodeId);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Could not add node with error code %s",
                            UA_StatusCode_name(result->statusCode));
    }
}